

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.cpp
# Opt level: O0

QString * UnixUtils::substituteFileBrowserParameters
                    (QString *__return_storage_ptr__,QString *pre,QString *file)

{
  bool bVar1;
  QChar QVar2;
  qsizetype qVar3;
  QLatin1Char local_17f;
  QChar local_17e;
  char16_t local_17c;
  QLatin1Char local_179;
  QChar local_178;
  QChar local_176;
  QLatin1Char local_173;
  QChar local_172;
  FileName local_170;
  QString local_158;
  QLatin1Char local_13b;
  QChar local_13a;
  QString local_138;
  QString local_120;
  QLatin1Char local_105;
  QChar local_104;
  QChar local_102;
  QLatin1Char local_ff;
  QChar local_fe;
  QLatin1Char local_fb;
  QChar local_fa;
  QString local_f8;
  QString local_e0;
  QLatin1Char local_c1;
  QChar local_c0;
  QChar local_be;
  QLatin1Char local_bb;
  QChar local_ba;
  QFileInfo local_b8 [8];
  QString local_b0;
  QLatin1Char local_93;
  QChar local_92;
  QString local_90;
  QString local_78;
  QLatin1Char local_5d;
  QChar local_5c;
  QChar local_5a;
  undefined1 local_58 [8];
  QString s;
  QChar c;
  int local_28;
  int i;
  QString *file_local;
  QString *pre_local;
  QString *cmd;
  
  QString::QString(__return_storage_ptr__);
  for (local_28 = 0; qVar3 = QString::size(pre), local_28 < qVar3; local_28 = local_28 + 1) {
    QVar2 = QString::at(pre,(long)local_28);
    QLatin1Char::QLatin1Char((QLatin1Char *)((long)&s.d.size + 5),'%');
    QChar::QChar((QChar *)((long)&s.d.size + 6),s.d.size._5_1_);
    bVar1 = ::operator==(QVar2,s.d.size._6_2_);
    if ((bVar1) && (qVar3 = QString::size(pre), (long)local_28 < qVar3 + -1)) {
      local_28 = local_28 + 1;
      QVar2 = QString::at(pre,(long)local_28);
      s.d.size._2_2_ = QVar2;
      QString::QString((QString *)local_58);
      local_5a = QVar2;
      QLatin1Char::QLatin1Char(&local_5d,'d');
      QChar::QChar(&local_5c,local_5d);
      bVar1 = ::operator==(local_5a,local_5c);
      if (bVar1) {
        QLatin1Char::QLatin1Char(&local_93,'\"');
        QChar::QChar(&local_92,local_93);
        QFileInfo::QFileInfo(local_b8,file);
        QFileInfo::path();
        ::operator+(&local_90,local_92,&local_b0);
        QLatin1Char::QLatin1Char(&local_bb,'\"');
        QChar::QChar(&local_ba,local_bb);
        ::operator+(&local_78,&local_90,local_ba);
        QString::operator=((QString *)local_58,&local_78);
        QString::~QString(&local_78);
        QString::~QString(&local_90);
        QString::~QString(&local_b0);
        QFileInfo::~QFileInfo(local_b8);
      }
      else {
        local_be = QVar2;
        QLatin1Char::QLatin1Char(&local_c1,'f');
        QChar::QChar(&local_c0,local_c1);
        bVar1 = ::operator==(local_be,local_c0);
        if (bVar1) {
          QLatin1Char::QLatin1Char(&local_fb,'\"');
          QChar::QChar(&local_fa,local_fb);
          ::operator+(&local_f8,local_fa,file);
          QLatin1Char::QLatin1Char(&local_ff,'\"');
          QChar::QChar(&local_fe,local_ff);
          ::operator+(&local_e0,&local_f8,local_fe);
          QString::operator=((QString *)local_58,&local_e0);
          QString::~QString(&local_e0);
          QString::~QString(&local_f8);
        }
        else {
          local_102 = QVar2;
          QLatin1Char::QLatin1Char(&local_105,'n');
          QChar::QChar(&local_104,local_105);
          bVar1 = ::operator==(local_102,local_104);
          if (bVar1) {
            QLatin1Char::QLatin1Char(&local_13b,'\"');
            QChar::QChar(&local_13a,local_13b);
            FileName::fromString(&local_170,file);
            FileName::fileName(&local_158,&local_170);
            ::operator+(&local_138,local_13a,&local_158);
            QLatin1Char::QLatin1Char(&local_173,'\"');
            QChar::QChar(&local_172,local_173);
            ::operator+(&local_120,&local_138,local_172);
            QString::operator=((QString *)local_58,&local_120);
            QString::~QString(&local_120);
            QString::~QString(&local_138);
            QString::~QString(&local_158);
            FileName::~FileName(&local_170);
          }
          else {
            local_176 = QVar2;
            QLatin1Char::QLatin1Char(&local_179,'%');
            QChar::QChar(&local_178,local_179);
            bVar1 = ::operator==(local_176,local_178);
            if (bVar1) {
              local_17c = QVar2.ucs;
              QString::operator=((QString *)local_58,(QChar *)(ulong)(ushort)QVar2.ucs);
            }
            else {
              QLatin1Char::QLatin1Char(&local_17f,'%');
              QChar::QChar(&local_17e,local_17f);
              QString::operator=((QString *)local_58,(QChar *)(ulong)(ushort)local_17e.ucs);
              QString::operator+=((QString *)local_58,QVar2);
            }
          }
        }
      }
      QString::operator+=(__return_storage_ptr__,(QString *)local_58);
      QString::~QString((QString *)local_58);
    }
    else {
      QString::operator+=(__return_storage_ptr__,QVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString UnixUtils::substituteFileBrowserParameters(const QString &pre, const QString &file)
{
    QString cmd;
    for (int i = 0; i < pre.size(); ++i) {
        QChar c = pre.at(i);
        if (c == QLatin1Char('%') && i < pre.size()-1) {
            c = pre.at(++i);
            QString s;
            if (c == QLatin1Char('d')) {
                s = QLatin1Char('"') + QFileInfo(file).path() + QLatin1Char('"');
            } else if (c == QLatin1Char('f')) {
                s = QLatin1Char('"') + file + QLatin1Char('"');
            } else if (c == QLatin1Char('n')) {
                s = QLatin1Char('"') + FileName::fromString(file).fileName() + QLatin1Char('"');
            } else if (c == QLatin1Char('%')) {
                s = c;
            } else {
                s = QLatin1Char('%');
                s += c;
            }
            cmd += s;
            continue;
        }
        cmd += c;
    }
    return cmd;
}